

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::AddSignalSemaphore
          (DeviceContextVkImpl *this,ManagedSemaphore *pSignalSemaphore)

{
  Char *Message;
  char (*in_RCX) [28];
  value_type_conflict2 local_58;
  VkObjectType local_50 [3];
  undefined1 local_38 [8];
  string msg;
  ManagedSemaphore *pSignalSemaphore_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = pSignalSemaphore;
  if (pSignalSemaphore == (ManagedSemaphore *)0x0) {
    FormatString<char[26],char[28]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pSignalSemaphore != nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"AddSignalSemaphore",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
               ,0x15d);
    std::__cxx11::string::~string((string *)local_38);
  }
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
  ::
  emplace_back<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>*&>
            ((vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
              *)&this->m_SignalManagedSemaphores,
             (ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
              **)((long)&msg.field_2 + 8));
  local_50[0] = ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
                ::Get((ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
                       *)msg.field_2._8_8_);
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
            (&this->m_VkSignalSemaphores,local_50);
  local_58 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->m_SignalSemaphoreValues,&local_58);
  return;
}

Assistant:

void AddSignalSemaphore(ManagedSemaphore* pSignalSemaphore)
    {
        VERIFY_EXPR(pSignalSemaphore != nullptr);
        m_SignalManagedSemaphores.emplace_back(pSignalSemaphore);
        m_VkSignalSemaphores.push_back(pSignalSemaphore->Get());
        m_SignalSemaphoreValues.push_back(0); // Ignored for binary semaphore
    }